

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mousenu.c
# Opt level: O3

_Bool al_get_mouse_cursor_position(int *ret_x,int *ret_y)

{
  _func__Bool_int_ptr_int_ptr *UNRECOVERED_JUMPTABLE;
  _Bool _Var1;
  ALLEGRO_SYSTEM *pAVar2;
  
  pAVar2 = al_get_system_driver();
  UNRECOVERED_JUMPTABLE = pAVar2->vt->get_cursor_position;
  if (UNRECOVERED_JUMPTABLE != (_func__Bool_int_ptr_int_ptr *)0x0) {
    _Var1 = (*UNRECOVERED_JUMPTABLE)(ret_x,ret_y);
    return _Var1;
  }
  *ret_x = 0;
  *ret_y = 0;
  return false;
}

Assistant:

bool al_get_mouse_cursor_position(int *ret_x, int *ret_y)
{
   ALLEGRO_SYSTEM *alsys = al_get_system_driver();
   ASSERT(ret_x);
   ASSERT(ret_y);

   if (alsys->vt->get_cursor_position) {
      return alsys->vt->get_cursor_position(ret_x, ret_y);
   }
   else {
      *ret_x = 0;
      *ret_y = 0;
      return false;
   }
}